

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

void summaryindex::indexevents
               (string *fullfilename,vector<int,_std::allocator<int>_> *event_ids,
               map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summary_id_file_id_to_offset,int file_id)

{
  FILE *__stream;
  char *__filename;
  undefined8 uVar1;
  size_t sVar2;
  mapped_type *this;
  int local_74 [2];
  sampleslevelRec sr;
  summary_keyz k;
  int last_event_id;
  summarySampleslevelHeader sh;
  int summary_set;
  int samplesize;
  int stream_type;
  size_t i;
  long lStack_38;
  int summarycalcstream_type;
  longlong offset;
  FILE *fin;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *pmStack_20;
  int file_id_local;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summary_id_file_id_to_offset_local;
  vector<int,_std::allocator<int>_> *event_ids_local;
  string *fullfilename_local;
  
  fin._4_4_ = (OASIS_FLOAT)file_id;
  pmStack_20 = summary_id_file_id_to_offset;
  summary_id_file_id_to_offset_local =
       (map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)event_ids;
  event_ids_local = (vector<int,_std::allocator<int>_> *)fullfilename;
  __filename = (char *)std::__cxx11::string::c_str();
  offset = (longlong)fopen(__filename,"rb");
  __stream = _stderr;
  if ((FILE *)offset == (FILE *)0x0) {
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL: cannot open %s\n",uVar1);
    exit(1);
  }
  lStack_38 = 0;
  i._4_4_ = 0;
  sVar2 = fread((void *)((long)&i + 4),4,1,(FILE *)offset);
  if (sVar2 != 0) {
    lStack_38 = lStack_38 + 4;
  }
  if ((i._4_4_ & 0x3000000) != 0x3000000) {
    fprintf(_stderr,"FATAL: Not a summarycalc stream type %d\n",(ulong)(i._4_4_ & 0x3000000));
    exit(-1);
  }
  _samplesize = fread(&sh.expval,4,1,(FILE *)offset);
  if (_samplesize != 0) {
    lStack_38 = lStack_38 + 4;
  }
  sh.summary_id = 0;
  if (_samplesize != 0) {
    _samplesize = fread(&sh.summary_id,4,1,(FILE *)offset);
  }
  if (_samplesize != 0) {
    lStack_38 = lStack_38 + 4;
  }
  k.summary_id = -1;
  do {
    if (_samplesize == 0) {
      fclose((FILE *)offset);
      return;
    }
    _samplesize = fread(&k.fileindex,0xc,1,(FILE *)offset);
    if (_samplesize != 0) {
      sr.loss = fin._4_4_;
      this = std::
             map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             ::operator[](pmStack_20,(key_type *)&sr);
      std::vector<long_long,_std::allocator<long_long>_>::push_back(this,&stack0xffffffffffffffc8);
      if (k.fileindex != k.summary_id) {
        k.summary_id = k.fileindex;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)summary_id_file_id_to_offset_local,
                   &k.fileindex);
      }
      lStack_38 = lStack_38 + 0xc;
    }
    do {
      if ((_samplesize == 0) || (_samplesize = fread(local_74,8,1,(FILE *)offset), _samplesize == 0)
         ) break;
      lStack_38 = lStack_38 + 8;
    } while (local_74[0] != 0);
  } while( true );
}

Assistant:

void indexevents(const std::string& fullfilename, std::vector<int> &event_ids, std::map<summary_keyz, std::vector<long long>> &summary_id_file_id_to_offset, int file_id) {
	FILE* fin = fopen(fullfilename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  fullfilename.c_str());
		exit(EXIT_FAILURE);
	}
	long long offset = 0;
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	if (i != 0) offset += sizeof(summarycalcstream_type);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL: Not a summarycalc stream type %d\n",  stream_type);
		exit(-1);
	}

	stream_type = streamno_mask & summarycalcstream_type;
	int samplesize;
	i = fread(&samplesize, sizeof(samplesize), 1, fin);
	if (i != 0) offset += sizeof(samplesize);
	int summary_set = 0;
	if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
	if (i != 0) offset += sizeof(summary_set);
	summarySampleslevelHeader sh;
	int last_event_id = -1;
	while (i != 0) {
		i = fread(&sh, sizeof(sh), 1, fin);
		if (i != 0) {
			summary_keyz k;
			k.summary_id = sh.summary_id;
			k.fileindex = file_id;
			summary_id_file_id_to_offset[k].push_back(offset);
			if (sh.event_id != last_event_id) {
				last_event_id = sh.event_id;
				event_ids.push_back(sh.event_id);
			}
			// fprintf(stdout, "%d, %d, %lld\n", sh.summary_id,sh.event_id, offset);
			offset += sizeof(sh);
		}
		while (i != 0) {
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, fin);
			if (i != 0) offset += sizeof(sr);
			if (i == 0) break;
			if (sr.sidx == 0) break;
		}
	}

	fclose(fin);
}